

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O3

void stbrp_init_target(stbrp_context *context,int width,int height,stbrp_node *nodes,int num_nodes)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  
  auVar1 = _DAT_0015d7b0;
  if ((width < 0x10000) && (height < 0x10000)) {
    if (num_nodes < 2) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(num_nodes - 1U);
      lVar3 = uVar2 - 1;
      auVar4._8_4_ = (int)lVar3;
      auVar4._0_8_ = lVar3;
      auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar4 = auVar4 ^ _DAT_0015d7b0;
      auVar5 = _DAT_00163250;
      do {
        auVar6 = auVar5 ^ auVar1;
        lVar7 = auVar5._8_8_;
        if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                    auVar4._4_4_ < auVar6._4_4_) & 1)) {
          *(stbrp_node **)((long)&nodes->next + lVar3) = nodes + auVar5._0_8_ + 1;
        }
        if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
            auVar6._12_4_ <= auVar4._12_4_) {
          *(stbrp_node **)((long)&nodes[1].next + lVar3) = nodes + lVar7 + 1;
        }
        auVar5._0_8_ = auVar5._0_8_ + 2;
        auVar5._8_8_ = lVar7 + 2;
        lVar3 = lVar3 + 0x20;
      } while ((ulong)((uint)num_nodes >> 1 & 0x3fffffff) << 5 != lVar3);
    }
    nodes[uVar2].next = (stbrp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = nodes;
    context->active_head = context->extra;
    context->width = width;
    context->height = height;
    context->num_nodes = num_nodes;
    context->align = (int)((num_nodes - 1U) + width) / num_nodes;
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = (stbrp_coord)width;
    context->extra[1].y = 0xffff;
    context->extra[1].next = (stbrp_node *)0x0;
    return;
  }
  __assert_fail("width <= 0xffff && height <= 0xffff",
                "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_rect_pack.h"
                ,0x101,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
}

Assistant:

STBRP_DEF void stbrp_init_target(stbrp_context *context, int width, int height, stbrp_node *nodes, int num_nodes)
{
   int i;
#ifndef STBRP_LARGE_RECTS
   STBRP_ASSERT(width <= 0xffff && height <= 0xffff);
#endif

   for (i=0; i < num_nodes-1; ++i)
      nodes[i].next = &nodes[i+1];
   nodes[i].next = NULL;
   context->init_mode = STBRP__INIT_skyline;
   context->heuristic = STBRP_HEURISTIC_Skyline_default;
   context->free_head = &nodes[0];
   context->active_head = &context->extra[0];
   context->width = width;
   context->height = height;
   context->num_nodes = num_nodes;
   stbrp_setup_allow_out_of_mem(context, 0);

   // node 0 is the full width, node 1 is the sentinel (lets us not store width explicitly)
   context->extra[0].x = 0;
   context->extra[0].y = 0;
   context->extra[0].next = &context->extra[1];
   context->extra[1].x = (stbrp_coord) width;
#ifdef STBRP_LARGE_RECTS
   context->extra[1].y = (1<<30);
#else
   context->extra[1].y = 65535;
#endif
   context->extra[1].next = NULL;
}